

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.h
# Opt level: O3

bool __thiscall
spvtools::opt::CopyPropagateArrays::MemoryObject::Contains(MemoryObject *this,MemoryObject *other)

{
  pointer pAVar1;
  pointer pAVar2;
  pointer pAVar3;
  bool bVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  
  if (this->variable_inst_ == other->variable_inst_) {
    pAVar1 = (this->access_chain_).
             super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pAVar2 = (this->access_chain_).
             super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar5 = (long)pAVar2 - (long)pAVar1;
    pAVar3 = (other->access_chain_).
             super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar5 <= (ulong)((long)(other->access_chain_).
                               super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar3)) {
      if (pAVar2 == pAVar1) {
        return true;
      }
      uVar6 = 1;
      uVar7 = 0;
      do {
        bVar8 = pAVar3[uVar7].is_result_id == pAVar1[uVar7].is_result_id;
        bVar9 = pAVar3[uVar7].field_1.result_id == pAVar1[uVar7].field_1.result_id;
        bVar4 = bVar9 && bVar8;
        if (!bVar9 || !bVar8) {
          return bVar4;
        }
        uVar7 = (ulong)uVar6;
        uVar6 = uVar6 + 1;
      } while (uVar7 < (ulong)((long)uVar5 >> 3));
      return bVar4;
    }
  }
  return false;
}

Assistant:

Instruction* GetVariable() const { return variable_inst_; }